

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boards.cpp
# Opt level: O0

bool __thiscall Boards::freeput(Boards *this,int x,int y,int turn)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  int local_28;
  int i;
  int turn_local;
  int y_local;
  int x_local;
  Boards *this_local;
  
  pvVar2 = std::array<std::array<int,_16UL>,_16UL>::operator[](&this->board,(long)x);
  pvVar3 = std::array<int,_16UL>::operator[](pvVar2,(long)y);
  if (*pvVar3 == 0) {
    local_28 = 0;
    pvVar2 = std::array<std::array<int,_16UL>,_16UL>::operator[](&this->board,(long)x);
    pvVar3 = std::array<int,_16UL>::operator[](pvVar2,(long)y);
    *pvVar3 = turn;
    bVar1 = isPutable(this,x,y,1,0,turn);
    if (bVar1) {
      Reverse(this,x,y,1,0,turn);
    }
    bVar1 = isPutable(this,x,y,0,1,turn);
    if (bVar1) {
      Reverse(this,x,y,0,1,turn);
    }
    bVar1 = isPutable(this,x,y,-1,0,turn);
    if (bVar1) {
      Reverse(this,x,y,-1,0,turn);
    }
    bVar1 = isPutable(this,x,y,0,-1,turn);
    if (bVar1) {
      Reverse(this,x,y,0,-1,turn);
    }
    bVar1 = isPutable(this,x,y,1,1,turn);
    if (bVar1) {
      Reverse(this,x,y,1,1,turn);
    }
    bVar1 = isPutable(this,x,y,-1,-1,turn);
    if (bVar1) {
      Reverse(this,x,y,-1,-1,turn);
    }
    bVar1 = isPutable(this,x,y,1,-1,turn);
    if (bVar1) {
      Reverse(this,x,y,1,-1,turn);
    }
    bVar1 = isPutable(this,x,y,-1,1,turn);
    if (bVar1) {
      Reverse(this,x,y,-1,1,turn);
    }
    while( true ) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->delta,(long)local_28);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
      if (*pvVar5 == 0) break;
      local_28 = local_28 + 1;
    }
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->delta,(long)local_28);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
    *pvVar5 = turn;
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->delta,(long)local_28);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,1);
    *pvVar5 = x;
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->delta,(long)local_28);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,2);
    *pvVar5 = y;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Boards::freeput(int x, int y, int turn){
	if(board[x][y] != 0)return false;
	int i = 0;
	board[x][y] = turn;
	if(isPutable(x, y, 1, 0, turn)){
		Reverse(x, y, 1, 0, turn);
	}    //右
	if(isPutable(x, y, 0, 1, turn)){
		Reverse(x, y, 0, 1, turn);
	}    //下
	if(isPutable(x, y, -1, 0, turn)){
		Reverse(x, y, -1, 0, turn);
	}    //左
	if(isPutable(x, y, 0, -1, turn)){
		Reverse(x, y, 0, -1, turn);
	}    //上
	if(isPutable(x, y, 1, 1, turn)){
		Reverse(x, y, 1, 1, turn);
	}    //右下
	if(isPutable(x, y, -1, -1, turn)){
		Reverse(x, y, -1, -1, turn);
	}    //左上
	if(isPutable(x, y, 1, -1, turn)){
		Reverse(x, y, 1, -1, turn);
	}    //右上
	if(isPutable(x, y, -1, 1, turn)){
		Reverse(x, y, -1, 1, turn);
	}    //左下

	while(delta[i][0]){ i++; }
	delta[i][0] = turn;
	delta[i][1] = x;
	delta[i][2] = y;
	return true;
}